

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O1

uint32_t findTaggedAliasListsOffset(char *alias,char *standard,UErrorCode *pErrorCode)

{
  uint16_t uVar1;
  ushort uVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  size_t sVar10;
  uint16_t *puVar11;
  uint16_t *puVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  UErrorCode UVar18;
  ulong uVar19;
  uint32_t uVar20;
  ulong uVar21;
  char *dst;
  bool bVar22;
  bool bVar23;
  char strippedName [60];
  char local_78 [72];
  
  uVar6 = getTagNumber(standard);
  uVar1 = (gMainTable.optionTable)->stringNormalizationType;
  dst = alias;
  if (uVar1 != 0) {
    sVar10 = strlen(alias);
    if (0x3b < sVar10) {
      uVar13 = 0xffffffff;
      UVar18 = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_0033a8a8;
    }
    dst = local_78;
    ucnv_io_stripASCIIForCompare_63(dst,alias);
  }
  puVar5 = gMainTable.normalizedStringTable;
  puVar4 = gMainTable.stringTable;
  puVar3 = gMainTable.aliasList;
  uVar8 = 0;
  uVar20 = gMainTable.untaggedConvArraySize;
  uVar13 = gMainTable.untaggedConvArraySize >> 1;
  do {
    if (uVar1 == 0) {
      iVar16 = ucnv_compareNames_63(dst,(char *)(puVar4 + puVar3[uVar13]));
    }
    else {
      iVar16 = strcmp(dst,(char *)(puVar5 + puVar3[uVar13]));
    }
    uVar7 = uVar13;
    if ((-1 < iVar16) && (uVar7 = uVar20, uVar8 = uVar13, iVar16 == 0)) {
      UVar18 = U_AMBIGUOUS_ALIAS_WARNING;
      if (-1 < (short)gMainTable.untaggedConvArray[uVar13]) {
        UVar18 = U_ZERO_ERROR;
      }
      uVar13 = gMainTable.untaggedConvArray[uVar13] & 0xfff;
      goto LAB_0033a8a8;
    }
    uVar20 = uVar7;
    uVar7 = uVar20 + uVar8 >> 1;
    bVar22 = uVar13 != uVar7;
    uVar13 = uVar7;
  } while (bVar22);
  uVar13 = 0xffffffff;
  UVar18 = U_ZERO_ERROR;
LAB_0033a8a8:
  if (UVar18 != U_ZERO_ERROR) {
    *pErrorCode = UVar18;
  }
  uVar20 = gMainTable.converterListSize;
  puVar5 = gMainTable.stringTable;
  puVar4 = gMainTable.taggedAliasLists;
  puVar3 = gMainTable.taggedAliasArray;
  uVar8 = 0xffffffff;
  if ((uVar6 < gMainTable.tagListSize - 1) && (uVar13 < gMainTable.converterListSize)) {
    iVar16 = uVar6 * gMainTable.converterListSize;
    uVar2 = gMainTable.taggedAliasArray[uVar13 + iVar16];
    uVar8 = (uint)uVar2;
    if (((uVar2 == 0) || (gMainTable.taggedAliasLists[(ulong)uVar2 + 1] == 0)) &&
       ((uVar8 = 0, UVar18 == U_AMBIGUOUS_ALIAS_WARNING &&
        (uVar14 = (ulong)gMainTable.taggedAliasArraySize, uVar14 != 0)))) {
      uVar19 = 0;
      puVar11 = gMainTable.stringTable;
      do {
        uVar15 = (ulong)puVar3[uVar19];
        puVar12 = puVar11;
        if (uVar15 != 0) {
          uVar21 = (ulong)puVar4[uVar15];
          bVar22 = uVar21 != 0;
          if (bVar22) {
            bVar22 = true;
            uVar17 = 1;
            do {
              if (((ulong)puVar4[uVar15 + uVar17] != 0) &&
                 (iVar9 = ucnv_compareNames_63(alias,(char *)(puVar5 + puVar4[uVar15 + uVar17])),
                 iVar9 == 0)) break;
              bVar22 = uVar17 < uVar21;
              bVar23 = uVar17 != uVar21;
              uVar17 = uVar17 + 1;
            } while (bVar23);
          }
          if (bVar22) {
            uVar2 = puVar3[(uint)((int)((uVar19 & 0xffffffff) % (ulong)uVar20) + iVar16)];
            puVar12 = (uint16_t *)(ulong)uVar2;
            if ((uVar2 == 0) || (puVar4[(ulong)uVar2 + 1] == 0)) {
              bVar22 = true;
              puVar12 = (uint16_t *)((ulong)puVar11 & 0xffffffff);
            }
            else {
              bVar22 = false;
            }
            if (!bVar22) {
              return (uint32_t)puVar12;
            }
          }
          else {
            puVar12 = (uint16_t *)((ulong)puVar11 & 0xffffffff);
          }
        }
        uVar19 = uVar19 + 1;
        puVar11 = puVar12;
      } while (uVar19 != uVar14);
      uVar8 = 0;
    }
  }
  return uVar8;
}

Assistant:

static uint32_t
findTaggedAliasListsOffset(const char *alias, const char *standard, UErrorCode *pErrorCode) {
    uint32_t idx;
    uint32_t listOffset;
    uint32_t convNum;
    UErrorCode myErr = U_ZERO_ERROR;
    uint32_t tagNum = getTagNumber(standard);

    /* Make a quick guess. Hopefully they used a TR22 canonical alias. */
    convNum = findConverter(alias, NULL, &myErr);
    if (myErr != U_ZERO_ERROR) {
        *pErrorCode = myErr;
    }

    if (tagNum < (gMainTable.tagListSize - UCNV_NUM_HIDDEN_TAGS) && convNum < gMainTable.converterListSize) {
        listOffset = gMainTable.taggedAliasArray[tagNum*gMainTable.converterListSize + convNum];
        if (listOffset && gMainTable.taggedAliasLists[listOffset + 1]) {
            return listOffset;
        }
        if (myErr == U_AMBIGUOUS_ALIAS_WARNING) {
            /* Uh Oh! They used an ambiguous alias.
               We have to search the whole swiss cheese starting
               at the highest standard affinity.
               This may take a while.
            */
            for (idx = 0; idx < gMainTable.taggedAliasArraySize; idx++) {
                listOffset = gMainTable.taggedAliasArray[idx];
                if (listOffset && isAliasInList(alias, listOffset)) {
                    uint32_t currTagNum = idx/gMainTable.converterListSize;
                    uint32_t currConvNum = (idx - currTagNum*gMainTable.converterListSize);
                    uint32_t tempListOffset = gMainTable.taggedAliasArray[tagNum*gMainTable.converterListSize + currConvNum];
                    if (tempListOffset && gMainTable.taggedAliasLists[tempListOffset + 1]) {
                        return tempListOffset;
                    }
                    /* else keep on looking */
                    /* We could speed this up by starting on the next row
                       because an alias is unique per row, right now.
                       This would change if alias versioning appears. */
                }
            }
            /* The standard doesn't know about the alias */
        }
        /* else no default name */
        return 0;
    }
    /* else converter or tag not found */

    return UINT32_MAX;
}